

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinRoboKin_dns.c
# Opt level: O1

int jac(N_Vector y,N_Vector f,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  long *plVar9;
  double *pdVar10;
  double *pdVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  
  pdVar15 = (double *)N_VGetArrayPointer();
  dVar1 = *pdVar15;
  dVar2 = pdVar15[1];
  dVar3 = pdVar15[2];
  dVar4 = pdVar15[3];
  dVar5 = pdVar15[4];
  dVar6 = pdVar15[5];
  dVar7 = pdVar15[6];
  dVar8 = pdVar15[7];
  plVar9 = *(long **)((long)J->content + 0x20);
  pdVar15 = (double *)*plVar9;
  *pdVar15 = dVar3 * 0.004731 + -0.1238;
  pdVar10 = (double *)plVar9[1];
  *pdVar10 = dVar3 * -0.3578 + -0.001637;
  pdVar11 = (double *)plVar9[2];
  *pdVar11 = dVar1 * 0.004731 + dVar2 * -0.3578;
  puVar12 = (undefined8 *)plVar9[3];
  *puVar12 = 0xbfede1b089a02752;
  puVar13 = (undefined8 *)plVar9[6];
  *puVar13 = 0x3ff0000000000000;
  pdVar15[1] = dVar3 * 0.2238 + 0.2638;
  pdVar10[1] = dVar3 * 0.7623 + -0.07745;
  pdVar11[1] = dVar1 * 0.2238 + dVar2 * 0.7623;
  puVar12[1] = 0xbfe58c7e28240b78;
  puVar13[1] = 0xbff0000000000000;
  pdVar15[2] = 0.3578;
  pdVar10[2] = 0.004731;
  lVar16 = plVar9[5];
  *(double *)(lVar16 + 0x10) = dVar8;
  lVar14 = plVar9[7];
  *(double *)(lVar14 + 0x10) = dVar6;
  pdVar15[3] = -0.7623;
  pdVar10[3] = 0.2238;
  pdVar15[4] = dVar1 + dVar1;
  pdVar10[4] = dVar2 + dVar2;
  pdVar11[5] = dVar3 + dVar3;
  puVar12[5] = dVar4 + dVar4;
  *(double *)(plVar9[4] + 0x30) = dVar5 + dVar5;
  *(double *)(lVar16 + 0x30) = dVar6 + dVar6;
  puVar13[7] = dVar7 + dVar7;
  *(double *)(lVar14 + 0x38) = dVar8 + dVar8;
  lVar16 = 0;
  do {
    *(undefined8 *)(plVar9[lVar16] + 0x40 + lVar16 * 8) = 0xbff0000000000000;
    *(undefined8 *)(plVar9[lVar16 + 8] + 0x40 + lVar16 * 8) = 0x3ff0000000000000;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 8);
  lVar16 = 0;
  do {
    *(undefined8 *)(plVar9[lVar16] + 0x80 + lVar16 * 8) = 0x3ff0000000000000;
    *(undefined8 *)(plVar9[lVar16 + 0x10] + 0x80 + lVar16 * 8) = 0x3ff0000000000000;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 8);
  return 0;
}

Assistant:

static int jac(N_Vector y, N_Vector f, SUNMatrix J, void* user_data,
               N_Vector tmp1, N_Vector tmp2)
{
  int i;
  sunrealtype* yd;
  sunrealtype x1, x2, x3, x4, x5, x6, x7, x8;

  yd = N_VGetArrayPointer(y);

  x1 = yd[0];
  x2 = yd[1];
  x3 = yd[2];
  x4 = yd[3];
  x5 = yd[4];
  x6 = yd[5];
  x7 = yd[6];
  x8 = yd[7];

  /* Nonlinear equations */

  /*
     - 0.1238*x1 + x7 - 0.001637*x2
     - 0.9338*x4 + 0.004731*x1*x3 - 0.3578*x2*x3 - 0.3571
  */
  IJth(J, 1, 1) = -0.1238 + 0.004731 * x3;
  IJth(J, 1, 2) = -0.001637 - 0.3578 * x3;
  IJth(J, 1, 3) = 0.004731 * x1 - 0.3578 * x2;
  IJth(J, 1, 4) = -0.9338;
  IJth(J, 1, 7) = 1.0;

  /*
    0.2638*x1 - x7 - 0.07745*x2
    - 0.6734*x4 + 0.2238*x1*x3 + 0.7623*x2*x3 - 0.6022
  */
  IJth(J, 2, 1) = 0.2638 + 0.2238 * x3;
  IJth(J, 2, 2) = -0.07745 + 0.7623 * x3;
  IJth(J, 2, 3) = 0.2238 * x1 + 0.7623 * x2;
  IJth(J, 2, 4) = -0.6734;
  IJth(J, 2, 7) = -1.0;

  /*
    0.3578*x1 + 0.004731*x2 + x6*x8
  */
  IJth(J, 3, 1) = 0.3578;
  IJth(J, 3, 2) = 0.004731;
  IJth(J, 3, 6) = x8;
  IJth(J, 3, 8) = x6;

  /*
    - 0.7623*x1 + 0.2238*x2 + 0.3461
  */
  IJth(J, 4, 1) = -0.7623;
  IJth(J, 4, 2) = 0.2238;

  /*
    x1*x1 + x2*x2 - 1
  */
  IJth(J, 5, 1) = 2.0 * x1;
  IJth(J, 5, 2) = 2.0 * x2;

  /*
    x3*x3 + x4*x4 - 1
  */
  IJth(J, 6, 3) = 2.0 * x3;
  IJth(J, 6, 4) = 2.0 * x4;

  /*
    x5*x5 + x6*x6 - 1
  */
  IJth(J, 7, 5) = 2.0 * x5;
  IJth(J, 7, 6) = 2.0 * x6;

  /*
    x7*x7 + x8*x8 - 1
  */
  IJth(J, 8, 7) = 2.0 * x7;
  IJth(J, 8, 8) = 2.0 * x8;

  /*
    Lower bounds ( l_i = 1 + x_i >= 0)
    l_i - 1.0 - x_i
   */

  for (i = 1; i <= 8; i++)
  {
    IJth(J, 8 + i, i)     = -1.0;
    IJth(J, 8 + i, 8 + i) = 1.0;
  }

  /*
    Upper bounds ( u_i = 1 - x_i >= 0)
    u_i - 1.0 + x_i
   */

  for (i = 1; i <= 8; i++)
  {
    IJth(J, 16 + i, i)      = 1.0;
    IJth(J, 16 + i, 16 + i) = 1.0;
  }

  return (0);
}